

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_action.c
# Opt level: O0

void s98c_write(s98c *ctx,uint8_t n)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  long local_30;
  ptrdiff_t dump_offset;
  ptrdiff_t loop_offset;
  ptrdiff_t p_offset;
  uint8_t n_local;
  s98c *ctx_local;
  
  if (ctx->dump_buffer + ctx->dump_size <= ctx->p) {
    puVar1 = ctx->p;
    puVar2 = ctx->dump_buffer;
    dump_offset = 0;
    local_30 = 0;
    if (ctx->loop_start != (uint8_t *)0x0) {
      dump_offset = (long)ctx->loop_start - (long)ctx->dump_buffer;
    }
    if (ctx->dump_start != (uint8_t *)0x0) {
      local_30 = (long)ctx->dump_start - (long)ctx->dump_buffer;
    }
    ctx->dump_size = ctx->dump_size + 0x4000;
    puVar3 = (uint8_t *)realloc(ctx->dump_buffer,ctx->dump_size);
    ctx->dump_buffer = puVar3;
    ctx->p = ctx->dump_buffer + ((long)puVar1 - (long)puVar2);
    if (ctx->loop_start != (uint8_t *)0x0) {
      ctx->loop_start = ctx->dump_buffer + dump_offset;
    }
    if (ctx->dump_start != (uint8_t *)0x0) {
      ctx->dump_start = ctx->dump_buffer + local_30;
    }
  }
  puVar1 = ctx->p;
  ctx->p = puVar1 + 1;
  *puVar1 = n;
  return;
}

Assistant:

void s98c_write(struct s98c* ctx, uint8_t n)
{
    if(ctx->p >= ctx->dump_buffer + ctx->dump_size) {
        ptrdiff_t p_offset = ctx->p - ctx->dump_buffer;
        ptrdiff_t loop_offset = 0, dump_offset = 0;

        if(ctx->loop_start != NULL) {
            loop_offset = ctx->loop_start - ctx->dump_buffer;
        }
        if(ctx->dump_start != NULL) {
            dump_offset = ctx->dump_start - ctx->dump_buffer;
        }

        ctx->dump_size += DUMP_SIZE_INCREMENT;
        ctx->dump_buffer = realloc(ctx->dump_buffer, ctx->dump_size);

        ctx->p = ctx->dump_buffer + p_offset;
        if(ctx->loop_start != NULL) {
            ctx->loop_start = ctx->dump_buffer + loop_offset;
        }
        if(ctx->dump_start != NULL) {
            ctx->dump_start = ctx->dump_buffer + dump_offset;
        }
    }
    
    *ctx->p++ = n;
}